

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::ensure_valid_name
          (string *__return_storage_ptr__,CompilerMSL *this,string *name,string *pfx)

{
  char *pcVar1;
  ulong uVar2;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  uVar2 = name->_M_string_length;
  if (((uVar2 < 2) || (*pcVar1 != '_')) || (9 < (int)pcVar1[1] - 0x30U)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar2);
  }
  else {
    ::std::operator+(__return_storage_ptr__,pfx,name);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::ensure_valid_name(string name, string pfx)
{
	return (name.size() >= 2 && name[0] == '_' && isdigit(name[1])) ? (pfx + name) : name;
}